

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowcontainer.cpp
# Opt level: O2

void __thiscall QWindowContainer::~QWindowContainer(QWindowContainer *this)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  
  *(undefined ***)this = &PTR_metaObject_007c22c0;
  *(undefined ***)(this + 0x10) = &PTR__QWindowContainer_007c2470;
  lVar1 = *(long *)(this + 8);
  bVar3 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 600));
  if (bVar3) {
    QObject::removeEventFilter(*(QObject **)(lVar1 + 0x260));
    QWindow::destroy();
  }
  lVar2 = *(long *)(lVar1 + 600);
  if (((lVar2 != 0) && (*(int *)(lVar2 + 4) != 0)) && (*(long **)(lVar1 + 0x260) != (long *)0x0)) {
    (**(code **)(**(long **)(lVar1 + 0x260) + 0x20))();
  }
  QWidget::~QWidget((QWidget *)this);
  return;
}

Assistant:

QWindowContainer::~QWindowContainer()
{
    Q_D(QWindowContainer);

    // Call destroy() explicitly first. The dtor would do this too, but
    // QEvent::PlatformSurface delivery relies on virtuals. Getting
    // SurfaceAboutToBeDestroyed can be essential for OpenGL, Vulkan, etc.
    // QWindow subclasses in particular. Keep these working.
    if (d->window) {
        d->window->removeEventFilter(this);
        d->window->destroy();
    }

    delete d->window;
}